

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::AddTapscriptSignRequest::~AddTapscriptSignRequest(AddTapscriptSignRequest *this)

{
  AddTapscriptSignRequest *this_local;
  
  ~AddTapscriptSignRequest(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~AddTapscriptSignRequest() {
    // do nothing
  }